

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::ParsedScene::MakeNamedMaterial
          (ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  pointer ppVar1;
  size_t __n;
  FileLoc loc_00;
  int iVar2;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
  *nm;
  pointer ppVar3;
  bool bVar4;
  ParameterDictionary dict;
  string local_2e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
  local_2c0;
  ParameterDictionary local_200;
  ParameterDictionary local_198;
  SceneEntity local_130;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_90;
  
  if (this->currentApiState == OptionsBlock) {
    local_2c0.first._M_dataplus._M_p = (pointer)&local_2c0.first.field_2;
    local_2c0.first._M_string_length = 0;
    local_2c0.first.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[18]>
              (&local_2c0.first,
               "Scene description must be inside world block; \"%s\" not allowed. Ignoring.",
               (char (*) [18])"MakeNamedMaterial");
    Error((FileLoc *)&params,local_2c0.first._M_dataplus._M_p);
  }
  else {
    if (this->currentApiState != Uninitialized) {
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::InlinedVector(&local_90,in_RDX);
      ParameterDictionary::ParameterDictionary
                (&local_198,&local_90,&this->graphicsState->materialAttributes,
                 this->graphicsState->colorSpace);
      local_90.nStored = 0;
      (*(local_90.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_90.alloc.memoryResource,local_90.ptr,local_90.nAlloc << 3,8);
      ppVar1 = (this->namedMaterials).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar3 = (this->namedMaterials).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1
          ) {
        __n = (ppVar3->first)._M_string_length;
        if (__n == name->_M_string_length) {
          if (__n == 0) {
            bVar4 = true;
          }
          else {
            iVar2 = bcmp((ppVar3->first)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
            bVar4 = iVar2 == 0;
          }
        }
        else {
          bVar4 = false;
        }
        if ((bVar4) &&
           (SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                      (&this->super_SceneRepresentation,(FileLoc *)&params,
                       "%s: named material redefined.",name), bVar4)) goto LAB_00209049;
      }
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"");
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::InlinedVector(&local_200.params,&local_198.params);
      local_200.colorSpace = local_198.colorSpace;
      loc_00.filename._M_str = (char *)params.ptr;
      loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
      loc_00._16_8_ = params.field_2.fixed[0];
      SceneEntity::SceneEntity(&local_130,&local_2e0,&local_200,loc_00);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
      ::pair<pbrt::SceneEntity,_true>(&local_2c0,name,&local_130);
      std::
      vector<std::pair<std::__cxx11::string,pbrt::SceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::SceneEntity>>>
      ::emplace_back<std::pair<std::__cxx11::string,pbrt::SceneEntity>>
                ((vector<std::pair<std::__cxx11::string,pbrt::SceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::SceneEntity>>>
                  *)&this->namedMaterials,&local_2c0);
      local_2c0.second.parameters.params.nStored = 0;
      (*(local_2c0.second.parameters.params.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_2c0.second.parameters.params.alloc.memoryResource,
                 local_2c0.second.parameters.params.ptr,
                 local_2c0.second.parameters.params.nAlloc << 3,8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0.second.name._M_dataplus._M_p != &local_2c0.second.name.field_2) {
        operator_delete(local_2c0.second.name._M_dataplus._M_p,
                        local_2c0.second.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0.first._M_dataplus._M_p != &local_2c0.first.field_2) {
        operator_delete(local_2c0.first._M_dataplus._M_p,
                        CONCAT71(local_2c0.first.field_2._M_allocated_capacity._1_7_,
                                 local_2c0.first.field_2._M_local_buf[0]) + 1);
      }
      local_130.parameters.params.nStored = 0;
      (*(local_130.parameters.params.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_130.parameters.params.alloc.memoryResource,local_130.parameters.params.ptr,
                 local_130.parameters.params.nAlloc << 3,8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.name._M_dataplus._M_p != &local_130.name.field_2) {
        operator_delete(local_130.name._M_dataplus._M_p,
                        local_130.name.field_2._M_allocated_capacity + 1);
      }
      local_200.params.nStored = 0;
      (*(local_200.params.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_200.params.alloc.memoryResource,local_200.params.ptr,
                 local_200.params.nAlloc << 3,8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
LAB_00209049:
      local_198.params.nStored = 0;
      (*(local_198.params.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_198.params.alloc.memoryResource,local_198.params.ptr,
                 local_198.params.nAlloc << 3,8);
      return;
    }
    local_2c0.first._M_dataplus._M_p = (pointer)&local_2c0.first.field_2;
    local_2c0.first._M_string_length = 0;
    local_2c0.first.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[18]>
              (&local_2c0.first,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [18])"MakeNamedMaterial");
    Error((FileLoc *)&params,local_2c0.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.first._M_dataplus._M_p != &local_2c0.first.field_2) {
    operator_delete(local_2c0.first._M_dataplus._M_p,
                    CONCAT71(local_2c0.first.field_2._M_allocated_capacity._1_7_,
                             local_2c0.first.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ParsedScene::MakeNamedMaterial(const std::string &name, ParsedParameterVector params,
                                    FileLoc loc) {
    VERIFY_WORLD("MakeNamedMaterial");

    ParameterDictionary dict(std::move(params), graphicsState->materialAttributes,
                             graphicsState->colorSpace);

    // Note: O(n). FIXME?
    for (const auto &nm : namedMaterials)
        if (nm.first == name) {
            ErrorExitDeferred(&loc, "%s: named material redefined.", name);
            return;
        }

    namedMaterials.push_back(std::make_pair(name, SceneEntity("", std::move(dict), loc)));
}